

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O3

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  ImGuiContext *pIVar1;
  ImGuiIO *pIVar2;
  long *plVar3;
  
  pIVar1 = ImGui::GetCurrentContext();
  if (pIVar1 == (ImGuiContext *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    pIVar2 = ImGui::GetIO();
    plVar3 = (long *)pIVar2->BackendPlatformUserData;
  }
  if (((code *)plVar3[0x12] != (code *)0x0) && ((GLFWwindow *)*plVar3 == window)) {
    (*(code *)plVar3[0x12])(window,button,action,mods);
  }
  ImGui_ImplGlfw_UpdateKeyModifiers(mods);
  pIVar2 = ImGui::GetIO();
  if ((uint)button < 5) {
    ImGuiIO::AddMouseButtonEvent(pIVar2,button,action == 1);
    return;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_MouseButtonCallback(GLFWwindow* window, int button, int action, int mods)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackMousebutton != nullptr && window == bd->Window)
        bd->PrevUserCallbackMousebutton(window, button, action, mods);

    ImGui_ImplGlfw_UpdateKeyModifiers(mods);

    ImGuiIO& io = ImGui::GetIO();
    if (button >= 0 && button < ImGuiMouseButton_COUNT)
        io.AddMouseButtonEvent(button, action == GLFW_PRESS);
}